

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward_int8_x86
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  int *piVar10;
  _func_int **pp_Var11;
  void *pvVar12;
  Layer *pLVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 uVar18;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined4 uVar26;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined1 uVar31;
  undefined1 uVar33;
  undefined1 auVar34 [14];
  undefined1 auVar35 [12];
  unkbyte10 Var36;
  undefined1 auVar37 [14];
  undefined1 auVar38 [12];
  unkbyte10 Var39;
  undefined1 auVar40 [12];
  undefined1 auVar41 [16];
  undefined8 uVar42;
  undefined1 uVar43;
  uint uVar44;
  uint _elempack;
  long lVar45;
  undefined4 *puVar46;
  long lVar47;
  int iVar48;
  Mat *dst;
  ulong uVar49;
  long lVar50;
  uint uVar51;
  int iVar52;
  int iVar53;
  _func_int *p_Var54;
  size_type __n;
  float fVar55;
  int iVar56;
  long lVar57;
  int iVar58;
  Option *_elemsize;
  Option *opt_00;
  int iVar59;
  undefined1 (*pauVar60) [16];
  undefined1 (*pauVar61) [16];
  ulong uVar62;
  bool bVar63;
  undefined1 auVar64 [16];
  ushort uVar65;
  ushort uVar70;
  ushort uVar71;
  int iVar72;
  ushort uVar74;
  int iVar75;
  ushort uVar77;
  int iVar78;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  ushort uVar73;
  ushort uVar76;
  ushort uVar79;
  undefined1 auVar69 [16];
  float fVar81;
  float fVar82;
  v4sf one;
  float fVar83;
  int iVar84;
  float fVar85;
  int iVar100;
  int iVar102;
  int iVar104;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar101;
  float fVar103;
  float fVar105;
  undefined1 auVar99 [16];
  float fVar106;
  char cVar119;
  char cVar120;
  char cVar121;
  char cVar122;
  float fVar123;
  char cVar124;
  char cVar125;
  float fVar126;
  undefined1 auVar107 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar127;
  float fVar128;
  float fVar141;
  float fVar142;
  undefined1 auVar129 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar143;
  undefined1 auVar140 [16];
  int iVar144;
  short sVar149;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined4 uVar153;
  undefined4 uVar154;
  undefined4 uVar155;
  undefined4 uVar156;
  Option opt_q;
  float top_rescale;
  Mat bottom_blob_bordered;
  float scale_out;
  Option opt_g;
  int local_334;
  int local_330;
  float *local_318;
  undefined1 local_308 [48];
  undefined1 local_2d8 [16];
  size_t local_2c8;
  float *local_2c0;
  Mat *local_2b8;
  ulong local_2b0;
  long local_2a8;
  pointer local_2a0;
  Mat local_298;
  ulong local_248;
  pointer local_240;
  Mat local_238;
  void *local_1e8;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  int local_1d0;
  Allocator *local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  int local_1b0;
  ulong local_1a8;
  void *local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 local_188;
  undefined4 uStack_184;
  int local_180;
  Allocator *local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  int local_160;
  ulong local_158;
  undefined1 local_148 [16];
  long local_130;
  Mat local_128;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  int iStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 uVar20;
  undefined3 uVar22;
  undefined2 uVar24;
  undefined4 uVar28;
  undefined3 uVar30;
  undefined2 uVar32;
  short sVar80;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar145 [12];
  undefined1 auVar146 [16];
  
  local_128.elempack = bottom_blob->elempack;
  local_128.c = bottom_blob->c;
  if (local_128.elempack == 0) {
    bVar63 = false;
  }
  else {
    bVar63 = ((int)bottom_blob->elemsize << 3) / local_128.elempack == 8;
  }
  p_Var54 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar48 = *(int *)(&this->field_0xd4 + (long)p_Var54);
  iVar52 = *(int *)(&this->field_0xdc + (long)p_Var54);
  iVar59 = *(int *)(&this->field_0xd8 + (long)p_Var54);
  iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var54);
  local_128.data = bottom_blob->data;
  piVar10 = bottom_blob->refcount;
  local_128.refcount._0_4_ = SUB84(piVar10,0);
  local_128.refcount._4_4_ = (undefined4)((ulong)piVar10 >> 0x20);
  local_128.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  local_128.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_128.allocator = bottom_blob->allocator;
  local_128.dims = bottom_blob->dims;
  local_128.w = bottom_blob->w;
  local_128.h = bottom_blob->h;
  local_128.d = bottom_blob->d;
  local_128.cstep = bottom_blob->cstep;
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + 1;
    UNLOCK();
  }
  local_2b8 = top_blob;
  if (!bVar63) {
    uVar49 = (long)(local_128.elempack * local_128.c) /
             (long)*(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
    local_238.cstep = 0;
    local_238.data = (undefined4 *)0x0;
    local_238.refcount._0_4_ = 0;
    local_238.refcount._4_4_ = 0;
    local_238.elemsize._0_4_ = 0;
    local_238.elemsize._4_4_ = 0;
    local_238.elempack = 0;
    local_238.allocator = (Allocator *)0x0;
    local_238.dims = 0;
    local_238.w = 0;
    local_238.h = 0;
    local_238.d = 0;
    local_238.c = 0;
    Mat::create(&local_238,local_128.elempack * local_128.c,4,(Allocator *)0x0);
    pp_Var11 = this->_vptr_ConvolutionDepthWise_x86;
    p_Var54 = pp_Var11[-3];
    if (0 < *(int *)(&this->field_0x108 + (long)p_Var54)) {
      lVar47 = 0;
      puVar46 = (undefined4 *)local_238.data;
      do {
        if (0 < (int)uVar49) {
          uVar153 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)p_Var54) + lVar47 * 4);
          uVar62 = uVar49 & 0xffffffff;
          do {
            *puVar46 = uVar153;
            puVar46 = puVar46 + 1;
            uVar51 = (int)uVar62 - 1;
            uVar62 = (ulong)uVar51;
          } while (uVar51 != 0);
        }
        lVar47 = lVar47 + 1;
        p_Var54 = pp_Var11[-3];
      } while (lVar47 < *(int *)(&this->field_0x108 + (long)p_Var54));
    }
    local_308._0_8_ = *(undefined8 *)opt;
    uVar18 = opt->openmp_blocktime;
    uVar19 = opt->use_winograd_convolution;
    uVar21 = opt->use_sgemm_convolution;
    uVar23 = opt->use_int8_inference;
    uVar25 = opt->use_vulkan_compute;
    uVar24 = CONCAT11(uVar25,uVar23);
    uVar22 = CONCAT21(uVar24,uVar21);
    uVar20 = CONCAT31(uVar22,uVar19);
    local_308._32_8_ = *(undefined8 *)&opt->use_bf16_storage;
    local_308._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    local_2d8._0_4_ = opt->flush_denormals;
    local_2d8[4] = opt->use_local_pool_allocator;
    local_2d8[5] = opt->use_reserved_1;
    local_2d8[6] = opt->use_reserved_2;
    local_2d8[7] = opt->use_reserved_3;
    local_2d8[8] = opt->use_reserved_4;
    local_2d8[9] = opt->use_reserved_5;
    local_2d8[10] = opt->use_reserved_6;
    local_2d8[0xb] = opt->use_reserved_7;
    local_2d8[0xc] = opt->use_reserved_8;
    local_2d8[0xd] = opt->use_reserved_9;
    local_2d8[0xe] = opt->use_reserved_10;
    local_2d8[0xf] = opt->use_reserved_11;
    local_308._16_4_ = SUB84(opt->workspace_allocator,0);
    local_308._20_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_308._8_4_ = SUB84(opt->workspace_allocator,0);
    local_308._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_308._24_4_ = uVar18;
    local_308._28_4_ = uVar20;
    quantize_to_int8(bottom_blob,&local_128,&local_238,(Option *)local_308);
    piVar10 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_238.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_238.data != (undefined4 *)0x0) {
            free(local_238.data);
          }
        }
        else {
          (*(local_238.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  local_238.cstep = 0;
  local_238.data = (pointer)0x0;
  local_238.refcount._0_4_ = 0;
  local_238.refcount._4_4_ = 0;
  local_238.elemsize._0_4_ = 0;
  local_238.elemsize._4_4_ = 0;
  local_238.elempack = 0;
  local_238.allocator = (Allocator *)0x0;
  local_238.dims = 0;
  local_238.w = 0;
  local_238.h = 0;
  local_238.d = 0;
  local_238.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86 +
             (long)this->_vptr_ConvolutionDepthWise_x86[-3]),&local_128,&local_238,opt);
  iVar53 = local_238.w;
  iVar56 = local_238.elempack;
  dst = local_2b8;
  iVar58 = -100;
  local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_);
  if (((pointer)local_238.data == (pointer)0x0) ||
     (local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_),
     (long)local_238.c * local_238.cstep == 0)) goto LAB_00291aa2;
  p_Var54 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar48 = (~((iVar48 + -1) * iVar52) + local_238.w) / *(int *)(&this->field_0xe4 + (long)p_Var54);
  iVar52 = iVar48 + 1;
  uVar49 = (long)(~((iVar59 + -1) * iVar8) + local_238.h) /
           (long)*(int *)(&this->field_0xe8 + (long)p_Var54);
  local_248 = uVar49 & 0xffffffff;
  iVar59 = (int)uVar49 + 1;
  uVar51 = local_238.c * local_238.elempack;
  if ((uVar51 == *(uint *)(&this->field_0x108 + (long)p_Var54)) &&
     (uVar9 = *(uint *)(&this->field_0xd0 + (long)p_Var54),
     *(uint *)(&this->field_0x108 + (long)p_Var54) == uVar9)) {
    uVar51 = 8;
    if (opt->use_packing_layout == false) {
      uVar51 = 1;
    }
    if ((uVar9 & 7) != 0) {
      uVar51 = 1;
    }
    opt_00 = (Option *)(ulong)uVar51;
    iVar8 = *(int *)(&this->field_0x10c + (long)p_Var54);
    _elemsize = (Option *)(ulong)(uVar51 * 4);
    if (100 < iVar8) {
      _elemsize = opt_00;
    }
    local_240 = (pointer)(ulong)(uint)local_238.c;
    Mat::create(local_2b8,iVar52,iVar59,(int)uVar9 / (int)uVar51,(size_t)_elemsize,uVar51,
                opt->blob_allocator);
    iVar58 = -100;
    local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_);
    if ((dst->data == (void *)0x0) ||
       (local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_),
       (long)dst->c * dst->cstep == 0)) goto LAB_00291aa2;
    iVar58 = 0;
    if (iVar56 != 1) {
      local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_);
      if (iVar56 != 8) goto LAB_00291aa2;
      local_2a8 = CONCAT44(local_2a8._4_4_,8);
      local_2b0 = CONCAT44(local_2b0._4_4_,iVar53);
      uVar49 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) *
               (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_308,uVar49,(allocator_type *)&local_298)
      ;
      pp_Var11 = this->_vptr_ConvolutionDepthWise_x86;
      p_Var54 = pp_Var11[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var54)) {
        iVar52 = *(int *)(&this->field_0xe0 + (long)p_Var54);
        iVar59 = *(int *)(&this->field_0xdc + (long)p_Var54);
        iVar56 = *(int *)(&this->field_0xd4 + (long)p_Var54);
        iVar53 = 0;
        fVar55 = 0.0;
        iVar58 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var11[-3])) {
            lVar47 = 0;
            do {
              *(float *)(local_308._0_8_ + (iVar53 + lVar47) * 4) = fVar55;
              fVar55 = (float)((int)fVar55 + *(int *)(&this->field_0xdc + (long)pp_Var11[-3]));
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 < *(int *)(&this->field_0xd4 + (long)pp_Var11[-3]));
            iVar53 = iVar53 + (int)lVar47;
          }
          fVar55 = (float)((int)fVar55 + (iVar52 * (int)local_2b0 - iVar59 * iVar56));
          iVar58 = iVar58 + 1;
          opt_00 = (Option *)pp_Var11[-3];
        } while (iVar58 < *(int *)(&this->field_0xd8 + (long)opt_00));
      }
      auVar41 = _DAT_0032d810;
      if (0 < (int)local_240) {
        iVar59 = (int)uVar49 * 8;
        local_148._0_4_ = iVar59;
        iVar52 = 0;
        auVar64._0_12_ = ZEXT812(0);
        auVar64._12_4_ = 0;
        uVar153 = 0x42b0c0a5;
        uVar154 = 0x42b0c0a5;
        uVar155 = 0x42b0c0a5;
        uVar156 = 0x42b0c0a5;
        fVar55 = (float)DAT_0032d810;
        fVar81 = DAT_0032d810._4_4_;
        fVar82 = DAT_0032d810._8_4_;
        fVar83 = DAT_0032d810._12_4_;
        local_2a0 = (pointer)0x0;
        do {
          if (-1 < (int)local_248) {
            local_2c0 = (float *)(local_238.cstep * (long)local_2a0 *
                                  CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize)
                                 + (long)local_238.data);
            pauVar60 = (undefined1 (*) [16])
                       (local_2b8->cstep * (long)local_2a0 * local_2b8->elemsize +
                       (long)local_2b8->data);
            pp_Var11 = this->_vptr_ConvolutionDepthWise_x86;
            opt_00 = (Option *)((long)local_2a0 * 8);
            pvVar12 = (this->weight_data_int8).data;
            pauVar61 = pauVar60;
            iVar56 = 0;
            do {
              if (-1 < iVar48) {
                iVar53 = 0;
                do {
                  p_Var54 = pp_Var11[-3];
                  if ((int)uVar49 < 1) {
                    auVar137 = ZEXT816(0);
                    auVar91 = ZEXT816(0);
                  }
                  else {
                    iVar58 = 0;
                    iVar72 = 0;
                    iVar75 = 0;
                    iVar78 = 0;
                    uVar62 = 0;
                    iVar84 = 0;
                    iVar100 = 0;
                    iVar102 = 0;
                    iVar104 = 0;
                    do {
                      uVar7 = *(ulong *)((long)local_2c0 +
                                        (long)(int)*(pointer)(local_308._0_8_ + uVar62 * 4) * 8 +
                                        (long)*(int *)(&this->field_0xe8 + (long)p_Var54) *
                                        (long)iVar56 *
                                        (long)local_238.w *
                                        CONCAT44(local_238.elemsize._4_4_,
                                                 (undefined4)local_238.elemsize) +
                                        (long)(*(int *)(&this->field_0xe4 + (long)p_Var54) * iVar53
                                              * 8));
                      cVar119 = (char)(uVar7 >> 8);
                      cVar120 = (char)(uVar7 >> 0x10);
                      cVar121 = (char)(uVar7 >> 0x18);
                      cVar122 = (char)(uVar7 >> 0x20);
                      cVar124 = (char)(uVar7 >> 0x28);
                      cVar125 = (char)(uVar7 >> 0x30);
                      auVar112._8_6_ = 0;
                      auVar112._0_8_ = uVar7;
                      auVar112[0xe] = (char)(uVar7 >> 0x38);
                      auVar112[0xf] = -((long)uVar7 < 0);
                      auVar151._14_2_ = auVar112._14_2_;
                      auVar151._8_5_ = 0;
                      auVar151._0_8_ = uVar7;
                      auVar151[0xd] = -(cVar125 < '\0');
                      auVar111._13_3_ = auVar151._13_3_;
                      auVar111._8_4_ = 0;
                      auVar111._0_8_ = uVar7;
                      auVar111[0xc] = cVar125;
                      auVar139._12_4_ = auVar111._12_4_;
                      auVar139._8_3_ = 0;
                      auVar139._0_8_ = uVar7;
                      auVar139[0xb] = -(cVar124 < '\0');
                      auVar110._11_5_ = auVar139._11_5_;
                      auVar110._8_2_ = 0;
                      auVar110._0_8_ = uVar7;
                      auVar110[10] = cVar124;
                      auVar109._10_6_ = auVar110._10_6_;
                      auVar109[8] = 0;
                      auVar109._0_8_ = uVar7;
                      auVar109[9] = -(cVar122 < '\0');
                      auVar108._9_7_ = auVar109._9_7_;
                      auVar108[8] = cVar122;
                      auVar108._0_8_ = uVar7;
                      Var36 = CONCAT91(CONCAT81(auVar108._8_8_,-(cVar121 < '\0')),cVar121);
                      auVar35._2_10_ = Var36;
                      auVar35[1] = -(cVar120 < '\0');
                      auVar35[0] = cVar120;
                      auVar34._2_12_ = auVar35;
                      auVar34[1] = -(cVar119 < '\0');
                      auVar34[0] = cVar119;
                      auVar107._0_2_ = CONCAT11(-((char)uVar7 < '\0'),(char)uVar7);
                      auVar107._2_14_ = auVar34;
                      uVar7 = *(ulong *)((long)pvVar12 + uVar62 * 8 + (long)iVar52);
                      cVar119 = (char)(uVar7 >> 8);
                      cVar120 = (char)(uVar7 >> 0x10);
                      cVar121 = (char)(uVar7 >> 0x18);
                      cVar122 = (char)(uVar7 >> 0x20);
                      cVar124 = (char)(uVar7 >> 0x28);
                      cVar125 = (char)(uVar7 >> 0x30);
                      auVar136._8_6_ = 0;
                      auVar136._0_8_ = uVar7;
                      auVar136[0xe] = (char)(uVar7 >> 0x38);
                      auVar136[0xf] = -((long)uVar7 < 0);
                      auVar135._14_2_ = auVar136._14_2_;
                      auVar135._8_5_ = 0;
                      auVar135._0_8_ = uVar7;
                      auVar135[0xd] = -(cVar125 < '\0');
                      auVar134._13_3_ = auVar135._13_3_;
                      auVar134._8_4_ = 0;
                      auVar134._0_8_ = uVar7;
                      auVar134[0xc] = cVar125;
                      auVar133._12_4_ = auVar134._12_4_;
                      auVar133._8_3_ = 0;
                      auVar133._0_8_ = uVar7;
                      auVar133[0xb] = -(cVar124 < '\0');
                      auVar132._11_5_ = auVar133._11_5_;
                      auVar132._8_2_ = 0;
                      auVar132._0_8_ = uVar7;
                      auVar132[10] = cVar124;
                      auVar131._10_6_ = auVar132._10_6_;
                      auVar131[8] = 0;
                      auVar131._0_8_ = uVar7;
                      auVar131[9] = -(cVar122 < '\0');
                      auVar130._9_7_ = auVar131._9_7_;
                      auVar130[8] = cVar122;
                      auVar130._0_8_ = uVar7;
                      Var39 = CONCAT91(CONCAT81(auVar130._8_8_,-(cVar121 < '\0')),cVar121);
                      auVar38._2_10_ = Var39;
                      auVar38[1] = -(cVar120 < '\0');
                      auVar38[0] = cVar120;
                      auVar37._2_12_ = auVar38;
                      auVar37[1] = -(cVar119 < '\0');
                      auVar37[0] = cVar119;
                      auVar129._0_2_ = CONCAT11(-((char)uVar7 < '\0'),(char)uVar7);
                      auVar129._2_14_ = auVar37;
                      sVar149 = (short)Var39 * (short)Var36;
                      auVar137 = pmulhw(auVar129,auVar107);
                      iVar144 = CONCAT22(auVar137._6_2_,sVar149);
                      Var36 = CONCAT64(CONCAT42(iVar144,auVar137._4_2_),
                                       CONCAT22(auVar38._0_2_ * auVar35._0_2_,sVar149));
                      auVar40._4_8_ = (long)((unkuint10)Var36 >> 0x10);
                      auVar40._2_2_ = auVar137._2_2_;
                      auVar40._0_2_ = auVar37._0_2_ * auVar34._0_2_;
                      iVar58 = iVar58 + CONCAT22(auVar137._0_2_,auVar129._0_2_ * auVar107._0_2_);
                      iVar72 = iVar72 + auVar40._0_4_;
                      iVar75 = iVar75 + (int)((unkuint10)Var36 >> 0x10);
                      iVar78 = iVar78 + iVar144;
                      iVar144 = CONCAT22(auVar137._8_2_,auVar130._8_2_ * auVar108._8_2_);
                      auVar145._0_8_ =
                           CONCAT26(auVar137._10_2_,
                                    CONCAT24(auVar132._10_2_ * auVar110._10_2_,iVar144));
                      auVar145._8_2_ = auVar134._12_2_ * auVar111._12_2_;
                      auVar145._10_2_ = auVar137._12_2_;
                      auVar146._12_2_ = auVar135._14_2_ * auVar151._14_2_;
                      auVar146._0_12_ = auVar145;
                      auVar146._14_2_ = auVar137._14_2_;
                      iVar84 = iVar84 + iVar144;
                      iVar100 = iVar100 + (int)((ulong)auVar145._0_8_ >> 0x20);
                      iVar102 = iVar102 + auVar145._8_4_;
                      iVar104 = iVar104 + auVar146._12_4_;
                      uVar62 = uVar62 + 1;
                    } while ((uVar49 & 0xffffffff) != uVar62);
                    auVar91._0_4_ = (float)iVar58;
                    auVar91._4_4_ = (float)iVar72;
                    auVar91._8_4_ = (float)iVar75;
                    auVar91._12_4_ = (float)iVar78;
                    auVar137._0_4_ = (float)iVar84;
                    auVar137._4_4_ = (float)iVar100;
                    auVar137._8_4_ = (float)iVar102;
                    auVar137._12_4_ = (float)iVar104;
                  }
                  pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var54) +
                                    (long)local_2a0 * 0x20);
                  pfVar3 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var54) + 0x10 +
                                    (long)local_2a0 * 0x20);
                  pfVar2 = (float *)(*(long *)(&this->field_0x1f8 + (long)p_Var54) +
                                    (long)local_2a0 * 0x20);
                  pfVar4 = (float *)(*(long *)(&this->field_0x1f8 + (long)p_Var54) + 0x10 +
                                    (long)local_2a0 * 0x20);
                  auVar138._0_4_ = *pfVar1 * *pfVar2;
                  auVar138._4_4_ = pfVar1[1] * pfVar2[1];
                  auVar138._8_4_ = pfVar1[2] * pfVar2[2];
                  auVar138._12_4_ = pfVar1[3] * pfVar2[3];
                  auVar139 = rcpps(auVar138,auVar138);
                  auVar150._0_4_ = *pfVar3 * *pfVar4;
                  auVar150._4_4_ = pfVar3[1] * pfVar4[1];
                  auVar150._8_4_ = pfVar3[2] * pfVar4[2];
                  auVar150._12_4_ = pfVar3[3] * pfVar4[3];
                  auVar151 = rcpps(auVar150,auVar150);
                  auVar66._0_4_ = (float)(-(uint)(*pfVar2 != 0.0) & auVar139._0_4_) * auVar91._0_4_;
                  auVar66._4_4_ =
                       (float)(-(uint)(pfVar2[1] != 0.0) & auVar139._4_4_) * auVar91._4_4_;
                  auVar66._8_4_ =
                       (float)(-(uint)(pfVar2[2] != 0.0) & auVar139._8_4_) * auVar91._8_4_;
                  auVar66._12_4_ =
                       (float)(-(uint)(pfVar2[3] != 0.0) & auVar139._12_4_) * auVar91._12_4_;
                  auVar147._0_4_ =
                       (float)(-(uint)(*pfVar4 != 0.0) & auVar151._0_4_) * auVar137._0_4_;
                  auVar147._4_4_ =
                       (float)(-(uint)(pfVar4[1] != 0.0) & auVar151._4_4_) * auVar137._4_4_;
                  auVar147._8_4_ =
                       (float)(-(uint)(pfVar4[2] != 0.0) & auVar151._8_4_) * auVar137._8_4_;
                  auVar147._12_4_ =
                       (float)(-(uint)(pfVar4[3] != 0.0) & auVar151._12_4_) * auVar137._12_4_;
                  if (*(int *)(&this->field_0x100 + (long)p_Var54) != 0) {
                    auVar137 = *(undefined1 (*) [16])
                                (*(long *)(&this->field_0x1b0 + (long)p_Var54) +
                                (long)local_2a0 * 0x20);
                    auVar91 = *(undefined1 (*) [16])
                               (*(long *)(&this->field_0x1b0 + (long)p_Var54) + 0x10 +
                               (long)local_2a0 * 0x20);
                    auVar66._0_4_ = auVar66._0_4_ + auVar137._0_4_;
                    auVar66._4_4_ = auVar66._4_4_ + auVar137._4_4_;
                    auVar66._8_4_ = auVar66._8_4_ + auVar137._8_4_;
                    auVar66._12_4_ = auVar66._12_4_ + auVar137._12_4_;
                    auVar147._0_4_ = auVar147._0_4_ + auVar91._0_4_;
                    auVar147._4_4_ = auVar147._4_4_ + auVar91._4_4_;
                    auVar147._8_4_ = auVar147._8_4_ + auVar91._8_4_;
                    auVar147._12_4_ = auVar147._12_4_ + auVar91._12_4_;
                  }
                  iVar58 = *(int *)(&this->field_0x110 + (long)p_Var54) + -1;
                  fVar85 = auVar66._0_4_;
                  fVar101 = auVar66._4_4_;
                  fVar103 = auVar66._8_4_;
                  fVar105 = auVar66._12_4_;
                  switch(iVar58) {
                  case 0:
                    auVar66 = maxps(auVar66,auVar64);
                    break;
                  case 1:
                    auVar91 = maxps(auVar66,auVar64);
                    auVar137 = minps(auVar66,auVar64);
                    fVar85 = **(float **)(&this->field_0x118 + (long)p_Var54);
                    auVar66._4_4_ = fVar85 * auVar137._4_4_ + auVar91._4_4_;
                    auVar66._0_4_ = fVar85 * auVar137._0_4_ + auVar91._0_4_;
                    auVar66._8_4_ = fVar85 * auVar137._8_4_ + auVar91._8_4_;
                    auVar66._12_4_ = fVar85 * auVar137._12_4_ + auVar91._12_4_;
                    break;
                  case 2:
                    uVar5 = **(undefined4 **)(&this->field_0x118 + (long)p_Var54);
                    uVar6 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var54))[1];
                    auVar89._4_4_ = uVar5;
                    auVar89._0_4_ = uVar5;
                    auVar89._8_4_ = uVar5;
                    auVar89._12_4_ = uVar5;
                    auVar114._4_4_ = uVar6;
                    auVar114._0_4_ = uVar6;
                    auVar114._8_4_ = uVar6;
                    auVar114._12_4_ = uVar6;
                    auVar137 = maxps(auVar66,auVar89);
                    auVar66 = minps(auVar137,auVar114);
                    break;
                  case 3:
                    auVar67._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
                    auVar67._8_4_ = -fVar103;
                    auVar67._12_4_ = -fVar105;
                    auVar15._4_4_ = uVar154;
                    auVar15._0_4_ = uVar153;
                    auVar15._8_4_ = uVar155;
                    auVar15._12_4_ = uVar156;
                    auVar137 = minps(auVar67,auVar15);
                    auVar137 = maxps(auVar137,_DAT_00332010);
                    fVar101 = auVar137._0_4_ * 1.442695 + 0.5;
                    fVar105 = auVar137._4_4_ * 1.442695 + 0.5;
                    fVar123 = auVar137._8_4_ * 1.442695 + 0.5;
                    fVar127 = auVar137._12_4_ * 1.442695 + 0.5;
                    fVar85 = (float)(int)fVar101;
                    fVar103 = (float)(int)fVar105;
                    fVar106 = (float)(int)fVar123;
                    fVar126 = (float)(int)fVar127;
                    fVar85 = fVar85 - (float)(-(uint)(fVar101 < fVar85) & (uint)fVar55);
                    fVar103 = fVar103 - (float)(-(uint)(fVar105 < fVar103) & (uint)fVar81);
                    fVar106 = fVar106 - (float)(-(uint)(fVar123 < fVar106) & (uint)fVar82);
                    fVar126 = fVar126 - (float)(-(uint)(fVar127 < fVar126) & (uint)fVar83);
                    fVar101 = fVar85 * -0.6931472 + auVar137._0_4_;
                    fVar105 = fVar103 * -0.6931472 + auVar137._4_4_;
                    fVar123 = fVar106 * -0.6931472 + auVar137._8_4_;
                    fVar127 = fVar126 * -0.6931472 + auVar137._12_4_;
                    auVar90._0_4_ =
                         fVar101 + fVar55 +
                         (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) *
                            fVar101 + 0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5) *
                         fVar101 * fVar101;
                    auVar90._4_4_ =
                         fVar105 + fVar81 +
                         (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) *
                            fVar105 + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) *
                         fVar105 * fVar105;
                    auVar90._8_4_ =
                         fVar123 + fVar82 +
                         (((((fVar123 * 0.00019875691 + 0.0013981999) * fVar123 + 0.008333452) *
                            fVar123 + 0.041665796) * fVar123 + 0.16666666) * fVar123 + 0.5) *
                         fVar123 * fVar123;
                    auVar90._12_4_ =
                         fVar127 + fVar83 +
                         (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) *
                            fVar127 + 0.041665796) * fVar127 + 0.16666666) * fVar127 + 0.5) *
                         fVar127 * fVar127;
                    auVar115._0_4_ =
                         (float)((int)fVar85 * 0x800000 + (int)fVar55) * auVar90._0_4_ + fVar55;
                    auVar115._4_4_ =
                         (float)((int)fVar103 * 0x800000 + (int)fVar81) * auVar90._4_4_ + fVar81;
                    auVar115._8_4_ =
                         (float)((int)fVar106 * 0x800000 + (int)fVar82) * auVar90._8_4_ + fVar82;
                    auVar115._12_4_ =
                         (float)((int)fVar126 * 0x800000 + (int)fVar83) * auVar90._12_4_ + fVar83;
                    auVar137 = rcpps(auVar90,auVar115);
                    fVar85 = auVar137._0_4_;
                    fVar101 = auVar137._4_4_;
                    fVar103 = auVar137._8_4_;
                    fVar105 = auVar137._12_4_;
                    auVar66._0_4_ = (fVar55 - auVar115._0_4_ * fVar85) * fVar85 + fVar85;
                    auVar66._4_4_ = (fVar81 - auVar115._4_4_ * fVar101) * fVar101 + fVar101;
                    auVar66._8_4_ = (fVar82 - auVar115._8_4_ * fVar103) * fVar103 + fVar103;
                    auVar66._12_4_ = (fVar83 - auVar115._12_4_ * fVar105) * fVar105 + fVar105;
                    break;
                  case 4:
                    auVar14._4_4_ = uVar154;
                    auVar14._0_4_ = uVar153;
                    auVar14._8_4_ = uVar155;
                    auVar14._12_4_ = uVar156;
                    auVar137 = minps(auVar66,auVar14);
                    auVar137 = maxps(auVar137,_DAT_00332010);
                    fVar106 = auVar137._0_4_ * 1.442695 + 0.5;
                    fVar123 = auVar137._4_4_ * 1.442695 + 0.5;
                    fVar126 = auVar137._8_4_ * 1.442695 + 0.5;
                    fVar127 = auVar137._12_4_ * 1.442695 + 0.5;
                    fVar128 = (float)(int)fVar106;
                    fVar141 = (float)(int)fVar123;
                    fVar142 = (float)(int)fVar126;
                    fVar143 = (float)(int)fVar127;
                    fVar128 = fVar128 - (float)(-(uint)(fVar106 < fVar128) & (uint)fVar55);
                    fVar141 = fVar141 - (float)(-(uint)(fVar123 < fVar141) & (uint)fVar81);
                    fVar142 = fVar142 - (float)(-(uint)(fVar126 < fVar142) & (uint)fVar82);
                    fVar143 = fVar143 - (float)(-(uint)(fVar127 < fVar143) & (uint)fVar83);
                    fVar106 = auVar137._0_4_ - fVar128 * 0.6931472;
                    fVar123 = auVar137._4_4_ - fVar141 * 0.6931472;
                    fVar126 = auVar137._8_4_ - fVar142 * 0.6931472;
                    fVar127 = auVar137._12_4_ - fVar143 * 0.6931472;
                    auVar86._0_4_ =
                         (float)((int)fVar128 * 0x800000 + (int)fVar55) *
                         (fVar106 + fVar55 +
                         (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) *
                            fVar106 + 0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) *
                         fVar106 * fVar106) + fVar55;
                    auVar86._4_4_ =
                         (float)((int)fVar141 * 0x800000 + (int)fVar81) *
                         (fVar123 + fVar81 +
                         (((((fVar123 * 0.00019875691 + 0.0013981999) * fVar123 + 0.008333452) *
                            fVar123 + 0.041665796) * fVar123 + 0.16666666) * fVar123 + 0.5) *
                         fVar123 * fVar123) + fVar81;
                    auVar86._8_4_ =
                         (float)((int)fVar142 * 0x800000 + (int)fVar82) *
                         (fVar126 + fVar82 +
                         (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) *
                            fVar126 + 0.041665796) * fVar126 + 0.16666666) * fVar126 + 0.5) *
                         fVar126 * fVar126) + fVar82;
                    auVar86._12_4_ =
                         (float)((int)fVar143 * 0x800000 + (int)fVar83) *
                         (fVar127 + fVar83 +
                         (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) *
                            fVar127 + 0.041665796) * fVar127 + 0.16666666) * fVar127 + 0.5) *
                         fVar127 * fVar127) + fVar83;
                    auVar137 = maxps(auVar86,_DAT_003320a0);
                    fVar106 = (float)(auVar137._0_4_ & 0x807fffff | 0x3f000000);
                    fVar126 = (float)(auVar137._4_4_ & 0x807fffff | 0x3f000000);
                    fVar128 = (float)(auVar137._8_4_ & 0x807fffff | 0x3f000000);
                    fVar142 = (float)(auVar137._12_4_ & 0x807fffff | 0x3f000000);
                    fVar123 = fVar106 + -1.0 +
                              (float)(-(uint)(fVar106 < 0.70710677) & (uint)fVar106);
                    fVar127 = fVar126 + -1.0 +
                              (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar126);
                    fVar141 = fVar128 + -1.0 +
                              (float)(-(uint)(fVar128 < 0.70710677) & (uint)fVar128);
                    fVar143 = fVar142 + -1.0 +
                              (float)(-(uint)(fVar142 < 0.70710677) & (uint)fVar142);
                    auVar87._0_4_ =
                         ~-(uint)(auVar86._0_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar137._0_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar106 < 0.70710677) & (uint)fVar55)) * 0.6931472
                                 + fVar123 +
                                (((((((((fVar123 * 0.070376836 + -0.1151461) * fVar123 + 0.116769984
                                       ) * fVar123 + -0.12420141) * fVar123 + 0.14249323) * fVar123
                                    + -0.16668057) * fVar123 + 0.20000714) * fVar123 + -0.24999994)
                                  * fVar123 + 0.3333333) * fVar123 + -0.5) * fVar123 * fVar123) *
                               -2.0);
                    auVar87._4_4_ =
                         ~-(uint)(auVar86._4_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar137._4_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar81)) * 0.6931472
                                 + fVar127 +
                                (((((((((fVar127 * 0.070376836 + -0.1151461) * fVar127 + 0.116769984
                                       ) * fVar127 + -0.12420141) * fVar127 + 0.14249323) * fVar127
                                    + -0.16668057) * fVar127 + 0.20000714) * fVar127 + -0.24999994)
                                  * fVar127 + 0.3333333) * fVar127 + -0.5) * fVar127 * fVar127) *
                               -2.0);
                    auVar87._8_4_ =
                         ~-(uint)(auVar86._8_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar137._8_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar128 < 0.70710677) & (uint)fVar82)) * 0.6931472
                                 + fVar141 +
                                (((((((((fVar141 * 0.070376836 + -0.1151461) * fVar141 + 0.116769984
                                       ) * fVar141 + -0.12420141) * fVar141 + 0.14249323) * fVar141
                                    + -0.16668057) * fVar141 + 0.20000714) * fVar141 + -0.24999994)
                                  * fVar141 + 0.3333333) * fVar141 + -0.5) * fVar141 * fVar141) *
                               -2.0);
                    auVar87._12_4_ =
                         ~-(uint)(auVar86._12_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar137._12_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar142 < 0.70710677) & (uint)fVar83)) * 0.6931472
                                 + fVar143 +
                                (((((((((fVar143 * 0.070376836 + -0.1151461) * fVar143 + 0.116769984
                                       ) * fVar143 + -0.12420141) * fVar143 + 0.14249323) * fVar143
                                    + -0.16668057) * fVar143 + 0.20000714) * fVar143 + -0.24999994)
                                  * fVar143 + 0.3333333) * fVar143 + -0.5) * fVar143 * fVar143) *
                               -2.0);
                    auVar140._0_8_ =
                         CONCAT44(-(uint)(auVar86._4_4_ <= 0.0),-(uint)(auVar86._0_4_ <= 0.0)) &
                         0x7fffffff7fffffff;
                    auVar140._8_4_ = -(uint)(auVar86._8_4_ <= 0.0) & 0x7fffffff;
                    auVar140._12_4_ = -(uint)(auVar86._12_4_ <= 0.0) & 0x7fffffff;
                    auVar137 = minps(auVar140 | auVar87,_DAT_00332000);
                    auVar137 = maxps(auVar137,_DAT_00332010);
                    fVar128 = auVar137._0_4_ * 1.442695 + 0.5;
                    fVar141 = auVar137._4_4_ * 1.442695 + 0.5;
                    fVar142 = auVar137._8_4_ * 1.442695 + 0.5;
                    fVar143 = auVar137._12_4_ * 1.442695 + 0.5;
                    fVar106 = (float)(int)fVar128;
                    fVar123 = (float)(int)fVar141;
                    fVar126 = (float)(int)fVar142;
                    fVar127 = (float)(int)fVar143;
                    fVar106 = fVar106 - (float)(-(uint)(fVar128 < fVar106) & (uint)fVar55);
                    fVar123 = fVar123 - (float)(-(uint)(fVar141 < fVar123) & (uint)fVar81);
                    fVar126 = fVar126 - (float)(-(uint)(fVar142 < fVar126) & (uint)fVar82);
                    fVar127 = fVar127 - (float)(-(uint)(fVar143 < fVar127) & (uint)fVar83);
                    fVar128 = auVar137._0_4_ - fVar106 * 0.6931472;
                    fVar141 = auVar137._4_4_ - fVar123 * 0.6931472;
                    fVar142 = auVar137._8_4_ - fVar126 * 0.6931472;
                    fVar143 = auVar137._12_4_ - fVar127 * 0.6931472;
                    auVar88._0_4_ = fVar128 * fVar128;
                    auVar88._4_4_ = fVar141 * fVar141;
                    auVar88._8_4_ = fVar142 * fVar142;
                    auVar88._12_4_ = fVar143 * fVar143;
                    auVar113._0_4_ =
                         (float)((int)fVar106 * 0x800000 + (int)fVar55) *
                         (fVar128 + fVar55 +
                         (((((fVar128 * 0.00019875691 + 0.0013981999) * fVar128 + 0.008333452) *
                            fVar128 + 0.041665796) * fVar128 + 0.16666666) * fVar128 + 0.5) *
                         auVar88._0_4_) + fVar55;
                    auVar113._4_4_ =
                         (float)((int)fVar123 * 0x800000 + (int)fVar81) *
                         (fVar141 + fVar81 +
                         (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) *
                            fVar141 + 0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5) *
                         auVar88._4_4_) + fVar81;
                    auVar113._8_4_ =
                         (float)((int)fVar126 * 0x800000 + (int)fVar82) *
                         (fVar142 + fVar82 +
                         (((((fVar142 * 0.00019875691 + 0.0013981999) * fVar142 + 0.008333452) *
                            fVar142 + 0.041665796) * fVar142 + 0.16666666) * fVar142 + 0.5) *
                         auVar88._8_4_) + fVar82;
                    auVar113._12_4_ =
                         (float)((int)fVar127 * 0x800000 + (int)fVar83) *
                         (fVar143 + fVar83 +
                         (((((fVar143 * 0.00019875691 + 0.0013981999) * fVar143 + 0.008333452) *
                            fVar143 + 0.041665796) * fVar143 + 0.16666666) * fVar143 + 0.5) *
                         auVar88._12_4_) + fVar83;
                    auVar137 = rcpps(auVar88,auVar113);
                    fVar106 = auVar137._0_4_;
                    fVar123 = auVar137._4_4_;
                    fVar126 = auVar137._8_4_;
                    fVar127 = auVar137._12_4_;
                    auVar66._0_4_ =
                         fVar85 * (fVar106 + fVar106 + -1.0 +
                                  (2.0 - auVar113._0_4_ * (fVar106 + fVar106)) * fVar106);
                    auVar66._4_4_ =
                         fVar101 * (fVar123 + fVar123 + -1.0 +
                                   (2.0 - auVar113._4_4_ * (fVar123 + fVar123)) * fVar123);
                    auVar66._8_4_ =
                         fVar103 * (fVar126 + fVar126 + -1.0 +
                                   (2.0 - auVar113._8_4_ * (fVar126 + fVar126)) * fVar126);
                    auVar66._12_4_ =
                         fVar105 * (fVar127 + fVar127 + -1.0 +
                                   (2.0 - auVar113._12_4_ * (fVar127 + fVar127)) * fVar127);
                    uVar153 = (int)DAT_00332000;
                    uVar154 = DAT_00332000._4_4_;
                    uVar155 = DAT_00332000._8_4_;
                    uVar156 = DAT_00332000._12_4_;
                    break;
                  case 5:
                    fVar106 = **(float **)(&this->field_0x118 + (long)p_Var54);
                    fVar123 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                    auVar92._0_4_ = fVar106 * fVar85 + fVar123;
                    auVar92._4_4_ = fVar106 * fVar101 + fVar123;
                    auVar92._8_4_ = fVar106 * fVar103 + fVar123;
                    auVar92._12_4_ = fVar106 * fVar105 + fVar123;
                    auVar137 = maxps(auVar92,auVar64);
                    auVar137 = minps(auVar137,auVar41);
                    auVar66._0_4_ = fVar85 * auVar137._0_4_;
                    auVar66._4_4_ = fVar101 * auVar137._4_4_;
                    auVar66._8_4_ = fVar103 * auVar137._8_4_;
                    auVar66._12_4_ = fVar105 * auVar137._12_4_;
                  }
                  fVar85 = auVar147._0_4_;
                  fVar101 = auVar147._4_4_;
                  fVar103 = auVar147._8_4_;
                  fVar105 = auVar147._12_4_;
                  switch(iVar58) {
                  case 0:
                    auVar147 = maxps(auVar147,auVar64);
                    break;
                  case 1:
                    auVar137 = maxps(auVar147,auVar64);
                    auVar91 = minps(auVar147,auVar64);
                    fVar85 = **(float **)(&this->field_0x118 + (long)p_Var54);
                    auVar147._4_4_ = fVar85 * auVar91._4_4_ + auVar137._4_4_;
                    auVar147._0_4_ = fVar85 * auVar91._0_4_ + auVar137._0_4_;
                    auVar147._8_4_ = fVar85 * auVar91._8_4_ + auVar137._8_4_;
                    auVar147._12_4_ = fVar85 * auVar91._12_4_ + auVar137._12_4_;
                    break;
                  case 2:
                    uVar5 = **(undefined4 **)(&this->field_0x118 + (long)p_Var54);
                    uVar6 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var54))[1];
                    auVar96._4_4_ = uVar5;
                    auVar96._0_4_ = uVar5;
                    auVar96._8_4_ = uVar5;
                    auVar96._12_4_ = uVar5;
                    auVar117._4_4_ = uVar6;
                    auVar117._0_4_ = uVar6;
                    auVar117._8_4_ = uVar6;
                    auVar117._12_4_ = uVar6;
                    auVar137 = maxps(auVar147,auVar96);
                    auVar147 = minps(auVar137,auVar117);
                    break;
                  case 3:
                    auVar148._0_8_ = auVar147._0_8_ ^ 0x8000000080000000;
                    auVar148._8_4_ = -fVar103;
                    auVar148._12_4_ = -fVar105;
                    auVar17._4_4_ = uVar154;
                    auVar17._0_4_ = uVar153;
                    auVar17._8_4_ = uVar155;
                    auVar17._12_4_ = uVar156;
                    auVar137 = minps(auVar148,auVar17);
                    auVar137 = maxps(auVar137,_DAT_00332010);
                    fVar101 = auVar137._0_4_ * 1.442695 + 0.5;
                    fVar105 = auVar137._4_4_ * 1.442695 + 0.5;
                    fVar123 = auVar137._8_4_ * 1.442695 + 0.5;
                    fVar127 = auVar137._12_4_ * 1.442695 + 0.5;
                    fVar85 = (float)(int)fVar101;
                    fVar103 = (float)(int)fVar105;
                    fVar106 = (float)(int)fVar123;
                    fVar126 = (float)(int)fVar127;
                    fVar85 = fVar85 - (float)(-(uint)(fVar101 < fVar85) & (uint)fVar55);
                    fVar103 = fVar103 - (float)(-(uint)(fVar105 < fVar103) & (uint)fVar81);
                    fVar106 = fVar106 - (float)(-(uint)(fVar123 < fVar106) & (uint)fVar82);
                    fVar126 = fVar126 - (float)(-(uint)(fVar127 < fVar126) & (uint)fVar83);
                    fVar101 = fVar85 * -0.6931472 + auVar137._0_4_;
                    fVar105 = fVar103 * -0.6931472 + auVar137._4_4_;
                    fVar123 = fVar106 * -0.6931472 + auVar137._8_4_;
                    fVar127 = fVar126 * -0.6931472 + auVar137._12_4_;
                    auVar97._0_4_ =
                         fVar101 + fVar55 +
                         (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) *
                            fVar101 + 0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5) *
                         fVar101 * fVar101;
                    auVar97._4_4_ =
                         fVar105 + fVar81 +
                         (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) *
                            fVar105 + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) *
                         fVar105 * fVar105;
                    auVar97._8_4_ =
                         fVar123 + fVar82 +
                         (((((fVar123 * 0.00019875691 + 0.0013981999) * fVar123 + 0.008333452) *
                            fVar123 + 0.041665796) * fVar123 + 0.16666666) * fVar123 + 0.5) *
                         fVar123 * fVar123;
                    auVar97._12_4_ =
                         fVar127 + fVar83 +
                         (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) *
                            fVar127 + 0.041665796) * fVar127 + 0.16666666) * fVar127 + 0.5) *
                         fVar127 * fVar127;
                    auVar118._0_4_ =
                         (float)((int)fVar85 * 0x800000 + (int)fVar55) * auVar97._0_4_ + fVar55;
                    auVar118._4_4_ =
                         (float)((int)fVar103 * 0x800000 + (int)fVar81) * auVar97._4_4_ + fVar81;
                    auVar118._8_4_ =
                         (float)((int)fVar106 * 0x800000 + (int)fVar82) * auVar97._8_4_ + fVar82;
                    auVar118._12_4_ =
                         (float)((int)fVar126 * 0x800000 + (int)fVar83) * auVar97._12_4_ + fVar83;
                    auVar137 = rcpps(auVar97,auVar118);
                    fVar85 = auVar137._0_4_;
                    fVar101 = auVar137._4_4_;
                    fVar103 = auVar137._8_4_;
                    fVar105 = auVar137._12_4_;
                    auVar147._0_4_ = (fVar55 - auVar118._0_4_ * fVar85) * fVar85 + fVar85;
                    auVar147._4_4_ = (fVar81 - auVar118._4_4_ * fVar101) * fVar101 + fVar101;
                    auVar147._8_4_ = (fVar82 - auVar118._8_4_ * fVar103) * fVar103 + fVar103;
                    auVar147._12_4_ = (fVar83 - auVar118._12_4_ * fVar105) * fVar105 + fVar105;
                    break;
                  case 4:
                    auVar16._4_4_ = uVar154;
                    auVar16._0_4_ = uVar153;
                    auVar16._8_4_ = uVar155;
                    auVar16._12_4_ = uVar156;
                    auVar137 = minps(auVar147,auVar16);
                    auVar137 = maxps(auVar137,_DAT_00332010);
                    fVar106 = auVar137._0_4_ * 1.442695 + 0.5;
                    fVar123 = auVar137._4_4_ * 1.442695 + 0.5;
                    fVar126 = auVar137._8_4_ * 1.442695 + 0.5;
                    fVar127 = auVar137._12_4_ * 1.442695 + 0.5;
                    fVar128 = (float)(int)fVar106;
                    fVar141 = (float)(int)fVar123;
                    fVar142 = (float)(int)fVar126;
                    fVar143 = (float)(int)fVar127;
                    fVar128 = fVar128 - (float)(-(uint)(fVar106 < fVar128) & (uint)fVar55);
                    fVar141 = fVar141 - (float)(-(uint)(fVar123 < fVar141) & (uint)fVar81);
                    fVar142 = fVar142 - (float)(-(uint)(fVar126 < fVar142) & (uint)fVar82);
                    fVar143 = fVar143 - (float)(-(uint)(fVar127 < fVar143) & (uint)fVar83);
                    fVar106 = auVar137._0_4_ - fVar128 * 0.6931472;
                    fVar123 = auVar137._4_4_ - fVar141 * 0.6931472;
                    fVar126 = auVar137._8_4_ - fVar142 * 0.6931472;
                    fVar127 = auVar137._12_4_ - fVar143 * 0.6931472;
                    auVar93._0_4_ =
                         (float)((int)fVar128 * 0x800000 + (int)fVar55) *
                         (fVar106 + fVar55 +
                         (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) *
                            fVar106 + 0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) *
                         fVar106 * fVar106) + fVar55;
                    auVar93._4_4_ =
                         (float)((int)fVar141 * 0x800000 + (int)fVar81) *
                         (fVar123 + fVar81 +
                         (((((fVar123 * 0.00019875691 + 0.0013981999) * fVar123 + 0.008333452) *
                            fVar123 + 0.041665796) * fVar123 + 0.16666666) * fVar123 + 0.5) *
                         fVar123 * fVar123) + fVar81;
                    auVar93._8_4_ =
                         (float)((int)fVar142 * 0x800000 + (int)fVar82) *
                         (fVar126 + fVar82 +
                         (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) *
                            fVar126 + 0.041665796) * fVar126 + 0.16666666) * fVar126 + 0.5) *
                         fVar126 * fVar126) + fVar82;
                    auVar93._12_4_ =
                         (float)((int)fVar143 * 0x800000 + (int)fVar83) *
                         (fVar127 + fVar83 +
                         (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) *
                            fVar127 + 0.041665796) * fVar127 + 0.16666666) * fVar127 + 0.5) *
                         fVar127 * fVar127) + fVar83;
                    auVar137 = maxps(auVar93,_DAT_003320a0);
                    fVar106 = (float)(auVar137._0_4_ & 0x807fffff | 0x3f000000);
                    fVar126 = (float)(auVar137._4_4_ & 0x807fffff | 0x3f000000);
                    fVar128 = (float)(auVar137._8_4_ & 0x807fffff | 0x3f000000);
                    fVar142 = (float)(auVar137._12_4_ & 0x807fffff | 0x3f000000);
                    fVar123 = fVar106 + -1.0 +
                              (float)(-(uint)(fVar106 < 0.70710677) & (uint)fVar106);
                    fVar127 = fVar126 + -1.0 +
                              (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar126);
                    fVar141 = fVar128 + -1.0 +
                              (float)(-(uint)(fVar128 < 0.70710677) & (uint)fVar128);
                    fVar143 = fVar142 + -1.0 +
                              (float)(-(uint)(fVar142 < 0.70710677) & (uint)fVar142);
                    auVar94._0_4_ =
                         ~-(uint)(auVar93._0_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar137._0_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar106 < 0.70710677) & (uint)fVar55)) * 0.6931472
                                 + fVar123 +
                                (((((((((fVar123 * 0.070376836 + -0.1151461) * fVar123 + 0.116769984
                                       ) * fVar123 + -0.12420141) * fVar123 + 0.14249323) * fVar123
                                    + -0.16668057) * fVar123 + 0.20000714) * fVar123 + -0.24999994)
                                  * fVar123 + 0.3333333) * fVar123 + -0.5) * fVar123 * fVar123) *
                               -2.0);
                    auVar94._4_4_ =
                         ~-(uint)(auVar93._4_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar137._4_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar81)) * 0.6931472
                                 + fVar127 +
                                (((((((((fVar127 * 0.070376836 + -0.1151461) * fVar127 + 0.116769984
                                       ) * fVar127 + -0.12420141) * fVar127 + 0.14249323) * fVar127
                                    + -0.16668057) * fVar127 + 0.20000714) * fVar127 + -0.24999994)
                                  * fVar127 + 0.3333333) * fVar127 + -0.5) * fVar127 * fVar127) *
                               -2.0);
                    auVar94._8_4_ =
                         ~-(uint)(auVar93._8_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar137._8_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar128 < 0.70710677) & (uint)fVar82)) * 0.6931472
                                 + fVar141 +
                                (((((((((fVar141 * 0.070376836 + -0.1151461) * fVar141 + 0.116769984
                                       ) * fVar141 + -0.12420141) * fVar141 + 0.14249323) * fVar141
                                    + -0.16668057) * fVar141 + 0.20000714) * fVar141 + -0.24999994)
                                  * fVar141 + 0.3333333) * fVar141 + -0.5) * fVar141 * fVar141) *
                               -2.0);
                    auVar94._12_4_ =
                         ~-(uint)(auVar93._12_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar137._12_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar142 < 0.70710677) & (uint)fVar83)) * 0.6931472
                                 + fVar143 +
                                (((((((((fVar143 * 0.070376836 + -0.1151461) * fVar143 + 0.116769984
                                       ) * fVar143 + -0.12420141) * fVar143 + 0.14249323) * fVar143
                                    + -0.16668057) * fVar143 + 0.20000714) * fVar143 + -0.24999994)
                                  * fVar143 + 0.3333333) * fVar143 + -0.5) * fVar143 * fVar143) *
                               -2.0);
                    auVar152._0_8_ =
                         CONCAT44(-(uint)(auVar93._4_4_ <= 0.0),-(uint)(auVar93._0_4_ <= 0.0)) &
                         0x7fffffff7fffffff;
                    auVar152._8_4_ = -(uint)(auVar93._8_4_ <= 0.0) & 0x7fffffff;
                    auVar152._12_4_ = -(uint)(auVar93._12_4_ <= 0.0) & 0x7fffffff;
                    auVar137 = minps(auVar152 | auVar94,_DAT_00332000);
                    auVar137 = maxps(auVar137,_DAT_00332010);
                    fVar128 = auVar137._0_4_ * 1.442695 + 0.5;
                    fVar141 = auVar137._4_4_ * 1.442695 + 0.5;
                    fVar142 = auVar137._8_4_ * 1.442695 + 0.5;
                    fVar143 = auVar137._12_4_ * 1.442695 + 0.5;
                    fVar106 = (float)(int)fVar128;
                    fVar123 = (float)(int)fVar141;
                    fVar126 = (float)(int)fVar142;
                    fVar127 = (float)(int)fVar143;
                    fVar106 = fVar106 - (float)(-(uint)(fVar128 < fVar106) & (uint)fVar55);
                    fVar123 = fVar123 - (float)(-(uint)(fVar141 < fVar123) & (uint)fVar81);
                    fVar126 = fVar126 - (float)(-(uint)(fVar142 < fVar126) & (uint)fVar82);
                    fVar127 = fVar127 - (float)(-(uint)(fVar143 < fVar127) & (uint)fVar83);
                    fVar128 = auVar137._0_4_ - fVar106 * 0.6931472;
                    fVar141 = auVar137._4_4_ - fVar123 * 0.6931472;
                    fVar142 = auVar137._8_4_ - fVar126 * 0.6931472;
                    fVar143 = auVar137._12_4_ - fVar127 * 0.6931472;
                    auVar95._0_4_ = fVar128 * fVar128;
                    auVar95._4_4_ = fVar141 * fVar141;
                    auVar95._8_4_ = fVar142 * fVar142;
                    auVar95._12_4_ = fVar143 * fVar143;
                    auVar116._0_4_ =
                         (float)((int)fVar106 * 0x800000 + (int)fVar55) *
                         (fVar128 + fVar55 +
                         (((((fVar128 * 0.00019875691 + 0.0013981999) * fVar128 + 0.008333452) *
                            fVar128 + 0.041665796) * fVar128 + 0.16666666) * fVar128 + 0.5) *
                         auVar95._0_4_) + fVar55;
                    auVar116._4_4_ =
                         (float)((int)fVar123 * 0x800000 + (int)fVar81) *
                         (fVar141 + fVar81 +
                         (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) *
                            fVar141 + 0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5) *
                         auVar95._4_4_) + fVar81;
                    auVar116._8_4_ =
                         (float)((int)fVar126 * 0x800000 + (int)fVar82) *
                         (fVar142 + fVar82 +
                         (((((fVar142 * 0.00019875691 + 0.0013981999) * fVar142 + 0.008333452) *
                            fVar142 + 0.041665796) * fVar142 + 0.16666666) * fVar142 + 0.5) *
                         auVar95._8_4_) + fVar82;
                    auVar116._12_4_ =
                         (float)((int)fVar127 * 0x800000 + (int)fVar83) *
                         (fVar143 + fVar83 +
                         (((((fVar143 * 0.00019875691 + 0.0013981999) * fVar143 + 0.008333452) *
                            fVar143 + 0.041665796) * fVar143 + 0.16666666) * fVar143 + 0.5) *
                         auVar95._12_4_) + fVar83;
                    auVar137 = rcpps(auVar95,auVar116);
                    fVar106 = auVar137._0_4_;
                    fVar123 = auVar137._4_4_;
                    fVar126 = auVar137._8_4_;
                    fVar127 = auVar137._12_4_;
                    auVar147._0_4_ =
                         fVar85 * (fVar106 + fVar106 + -1.0 +
                                  (2.0 - auVar116._0_4_ * (fVar106 + fVar106)) * fVar106);
                    auVar147._4_4_ =
                         fVar101 * (fVar123 + fVar123 + -1.0 +
                                   (2.0 - auVar116._4_4_ * (fVar123 + fVar123)) * fVar123);
                    auVar147._8_4_ =
                         fVar103 * (fVar126 + fVar126 + -1.0 +
                                   (2.0 - auVar116._8_4_ * (fVar126 + fVar126)) * fVar126);
                    auVar147._12_4_ =
                         fVar105 * (fVar127 + fVar127 + -1.0 +
                                   (2.0 - auVar116._12_4_ * (fVar127 + fVar127)) * fVar127);
                    uVar153 = (int)DAT_00332000;
                    uVar154 = DAT_00332000._4_4_;
                    uVar155 = DAT_00332000._8_4_;
                    uVar156 = DAT_00332000._12_4_;
                    break;
                  case 5:
                    fVar106 = **(float **)(&this->field_0x118 + (long)p_Var54);
                    fVar123 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                    auVar98._0_4_ = fVar106 * fVar85 + fVar123;
                    auVar98._4_4_ = fVar106 * fVar101 + fVar123;
                    auVar98._8_4_ = fVar106 * fVar103 + fVar123;
                    auVar98._12_4_ = fVar106 * fVar105 + fVar123;
                    auVar137 = maxps(auVar98,auVar64);
                    auVar137 = minps(auVar137,auVar41);
                    auVar147._0_4_ = fVar85 * auVar137._0_4_;
                    auVar147._4_4_ = fVar101 * auVar137._4_4_;
                    auVar147._8_4_ = fVar103 * auVar137._8_4_;
                    auVar147._12_4_ = fVar105 * auVar137._12_4_;
                  }
                  if (iVar8 < 0x65) {
                    *pauVar60 = auVar66;
                    pauVar60[1] = auVar147;
                    pauVar60 = pauVar60 + 2;
                  }
                  else {
                    pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var54) +
                                      (long)local_2a0 * 0x20);
                    pfVar2 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var54) + 0x10 +
                                      (long)local_2a0 * 0x20);
                    fVar85 = *pfVar1 * auVar66._0_4_;
                    fVar101 = pfVar1[1] * auVar66._4_4_;
                    fVar103 = pfVar1[2] * auVar66._8_4_;
                    fVar105 = pfVar1[3] * auVar66._12_4_;
                    fVar106 = *pfVar2 * auVar147._0_4_;
                    fVar123 = pfVar2[1] * auVar147._4_4_;
                    fVar126 = pfVar2[2] * auVar147._8_4_;
                    fVar127 = pfVar2[3] * auVar147._12_4_;
                    auVar68._0_4_ = (int)((float)((uint)fVar85 & 0x80000000 | 0x3f000000) + fVar85);
                    auVar68._4_4_ =
                         (int)((float)((uint)fVar101 & 0x80000000 | 0x3f000000) + fVar101);
                    auVar68._8_4_ =
                         (int)((float)((uint)fVar103 & 0x80000000 | 0x3f000000) + fVar103);
                    auVar68._12_4_ =
                         (int)((float)((uint)fVar105 & 0x80000000 | 0x3f000000) + fVar105);
                    auVar99._0_4_ =
                         (int)((float)((uint)fVar106 & 0x80000000 | 0x3f000000) + fVar106);
                    auVar99._4_4_ =
                         (int)((float)((uint)fVar123 & 0x80000000 | 0x3f000000) + fVar123);
                    auVar99._8_4_ =
                         (int)((float)((uint)fVar126 & 0x80000000 | 0x3f000000) + fVar126);
                    auVar99._12_4_ =
                         (int)((float)((uint)fVar127 & 0x80000000 | 0x3f000000) + fVar127);
                    auVar137 = packssdw(auVar68,auVar99);
                    sVar149 = auVar137._0_2_;
                    uVar65 = (ushort)(0x7f < sVar149) * 0x7f | (ushort)(0x7f >= sVar149) * sVar149;
                    sVar149 = auVar137._2_2_;
                    uVar70 = (ushort)(0x7f < sVar149) * 0x7f | (ushort)(0x7f >= sVar149) * sVar149;
                    sVar149 = auVar137._4_2_;
                    uVar71 = (ushort)(0x7f < sVar149) * 0x7f | (ushort)(0x7f >= sVar149) * sVar149;
                    sVar149 = auVar137._6_2_;
                    uVar73 = (ushort)(0x7f < sVar149) * 0x7f | (ushort)(0x7f >= sVar149) * sVar149;
                    sVar149 = auVar137._8_2_;
                    uVar74 = (ushort)(0x7f < sVar149) * 0x7f | (ushort)(0x7f >= sVar149) * sVar149;
                    sVar149 = auVar137._10_2_;
                    uVar76 = (ushort)(0x7f < sVar149) * 0x7f | (ushort)(0x7f >= sVar149) * sVar149;
                    sVar149 = auVar137._12_2_;
                    sVar80 = auVar137._14_2_;
                    uVar77 = (ushort)(0x7f < sVar149) * 0x7f | (ushort)(0x7f >= sVar149) * sVar149;
                    uVar79 = (ushort)(0x7f < sVar80) * 0x7f | (ushort)(0x7f >= sVar80) * sVar80;
                    auVar69._0_2_ =
                         (ushort)((short)uVar65 < -0x7f) * -0x7f | ((short)uVar65 >= -0x7f) * uVar65
                    ;
                    auVar69._2_2_ =
                         (ushort)((short)uVar70 < -0x7f) * -0x7f | ((short)uVar70 >= -0x7f) * uVar70
                    ;
                    auVar69._4_2_ =
                         (ushort)((short)uVar71 < -0x7f) * -0x7f | ((short)uVar71 >= -0x7f) * uVar71
                    ;
                    auVar69._6_2_ =
                         (ushort)((short)uVar73 < -0x7f) * -0x7f | ((short)uVar73 >= -0x7f) * uVar73
                    ;
                    auVar69._8_2_ =
                         (ushort)((short)uVar74 < -0x7f) * -0x7f | ((short)uVar74 >= -0x7f) * uVar74
                    ;
                    auVar69._10_2_ =
                         (ushort)((short)uVar76 < -0x7f) * -0x7f | ((short)uVar76 >= -0x7f) * uVar76
                    ;
                    auVar69._12_2_ =
                         (ushort)((short)uVar77 < -0x7f) * -0x7f | ((short)uVar77 >= -0x7f) * uVar77
                    ;
                    auVar69._14_2_ =
                         (ushort)((short)uVar79 < -0x7f) * -0x7f | ((short)uVar79 >= -0x7f) * uVar79
                    ;
                    auVar137 = packsswb(auVar69,auVar69);
                    *(long *)*pauVar61 = auVar137._0_8_;
                    pauVar61 = (undefined1 (*) [16])((long)*pauVar61 + 8);
                  }
                  bVar63 = iVar53 != iVar48;
                  iVar53 = iVar53 + 1;
                } while (bVar63);
              }
              bVar63 = iVar56 != (int)local_248;
              iVar56 = iVar56 + 1;
            } while (bVar63);
          }
          local_2a0 = (pointer)((long)local_2a0 + 1);
          iVar52 = iVar52 + iVar59;
        } while (local_2a0 != local_240);
      }
      if ((pointer)local_308._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_308._0_8_,
                        CONCAT44(local_308._20_4_,local_308._16_4_) - local_308._0_8_);
      }
      iVar58 = 0;
      dst = local_2b8;
      iVar53 = (int)local_2b0;
      local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_);
      if ((int)local_2a8 != 1) goto LAB_00291aa2;
    }
    p_Var54 = this->_vptr_ConvolutionDepthWise_x86[-3];
    iVar52 = *(int *)(&this->field_0xd4 + (long)p_Var54);
    if ((long)iVar52 == 3) {
      if (((((*(int *)(&this->field_0xd8 + (long)p_Var54) == 3) &&
            (*(int *)(&this->field_0xe4 + (long)p_Var54) == 1)) &&
           (*(int *)(&this->field_0xe8 + (long)p_Var54) == 1)) &&
          ((*(int *)(&this->field_0xdc + (long)p_Var54) == 1 &&
           (*(int *)(&this->field_0xe0 + (long)p_Var54) == 1)))) &&
         (*(uint *)(&this->field_0x110 + (long)p_Var54) < 2)) {
        if (iVar8 < 0x65) {
          local_308._0_8_ = (pointer)0x0;
          local_308._8_8_ = (Allocator *)0x0;
          local_308._16_4_ = 0;
          local_308._20_4_ = 0;
          p_Var54 = (_func_int *)
                    ((long)&this->_vptr_ConvolutionDepthWise_x86 +
                    (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
          if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])) {
            lVar47 = 0;
            local_308._8_8_ = (float *)0x0;
            do {
              fVar55 = 1.0 / (*(float *)(*(long *)(p_Var54 + 0x1f8) + lVar47 * 4) *
                             *(float *)(*(long *)(p_Var54 + 0x240) + lVar47 * 4));
              local_298.data = (void *)CONCAT44(local_298.data._4_4_,fVar55);
              if ((float *)local_308._8_8_ == (float *)CONCAT44(local_308._20_4_,local_308._16_4_))
              {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_308,
                           (iterator)local_308._8_8_,(float *)&local_298);
              }
              else {
                *(float *)local_308._8_8_ = fVar55;
                local_308._8_8_ = local_308._8_8_ + 4;
              }
              lVar47 = lVar47 + 1;
              p_Var54 = (_func_int *)
                        ((long)&this->_vptr_ConvolutionDepthWise_x86 +
                        (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
            } while (lVar47 < *(int *)(&this->field_0x108 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_a8,(vector<float,_std::allocator<float>_> *)local_308);
          convdw3x3s1_int8_dequant_sse
                    (&local_238,dst,(Mat *)(p_Var54 + 0x168),(Mat *)(p_Var54 + 0x1b0),&local_a8,
                     opt_00);
        }
        else {
          local_308._0_8_ = (pointer)0x0;
          local_308._8_8_ = (Allocator *)0x0;
          local_308._16_4_ = 0;
          local_308._20_4_ = 0;
          p_Var54 = (_func_int *)
                    ((long)&this->_vptr_ConvolutionDepthWise_x86 +
                    (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
          if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])) {
            lVar47 = 0;
            local_308._8_8_ = (float *)0x0;
            do {
              fVar55 = *(float *)(*(long *)(p_Var54 + 0x1f8) + lVar47 * 4);
              fVar81 = 0.0;
              if (fVar55 != 0.0) {
                fVar81 = 1.0 / (fVar55 * *(float *)(*(long *)(p_Var54 + 0x240) + lVar47 * 4));
              }
              local_298.data = (void *)CONCAT44(local_298.data._4_4_,fVar81);
              local_1e8 = (void *)CONCAT44(local_1e8._4_4_,
                                           *(undefined4 *)(*(long *)(p_Var54 + 0x288) + lVar47 * 4))
              ;
              if ((float *)local_308._8_8_ == (float *)CONCAT44(local_308._20_4_,local_308._16_4_))
              {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_308,
                           (iterator)local_308._8_8_,(float *)&local_298);
              }
              else {
                *(float *)local_308._8_8_ = fVar81;
                local_308._8_8_ = local_308._8_8_ + 4;
              }
              if ((float *)local_308._8_8_ == (float *)CONCAT44(local_308._20_4_,local_308._16_4_))
              {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_308,
                           (iterator)local_308._8_8_,(float *)&local_1e8);
              }
              else {
                *(float *)local_308._8_8_ = local_1e8._0_4_;
                local_308._8_8_ = local_308._8_8_ + 4;
              }
              lVar47 = lVar47 + 1;
              p_Var54 = (_func_int *)
                        ((long)&this->_vptr_ConvolutionDepthWise_x86 +
                        (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
            } while (lVar47 < *(int *)(&this->field_0x108 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_90,(vector<float,_std::allocator<float>_> *)local_308);
          convdw3x3s1_int8_requant_sse
                    (&local_238,dst,(Mat *)(p_Var54 + 0x168),(Mat *)(p_Var54 + 0x1b0),&local_90,
                     opt_00);
          local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
        if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_308._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_308._0_8_,
                          CONCAT44(local_308._20_4_,local_308._16_4_) - local_308._0_8_);
        }
        pLVar13 = this->activation;
      }
      else {
        if ((((iVar52 != 3) || (*(int *)(&this->field_0xd8 + (long)p_Var54) != 3)) ||
            ((*(int *)(&this->field_0xdc + (long)p_Var54) != 1 ||
             (((*(int *)(&this->field_0xe0 + (long)p_Var54) != 1 ||
               (*(int *)(&this->field_0xe4 + (long)p_Var54) != 2)) ||
              (*(int *)(&this->field_0xe8 + (long)p_Var54) != 2)))))) ||
           (1 < *(uint *)(&this->field_0x110 + (long)p_Var54))) goto LAB_002914e4;
        if (iVar8 < 0x65) {
          local_308._0_8_ = (pointer)0x0;
          local_308._8_8_ = (Allocator *)0x0;
          local_308._16_4_ = 0;
          local_308._20_4_ = 0;
          p_Var54 = (_func_int *)
                    ((long)&this->_vptr_ConvolutionDepthWise_x86 +
                    (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
          if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])) {
            lVar47 = 0;
            local_308._8_8_ = (float *)0x0;
            do {
              fVar55 = 1.0 / (*(float *)(*(long *)(p_Var54 + 0x1f8) + lVar47 * 4) *
                             *(float *)(*(long *)(p_Var54 + 0x240) + lVar47 * 4));
              local_298.data = (void *)CONCAT44(local_298.data._4_4_,fVar55);
              if ((float *)local_308._8_8_ == (float *)CONCAT44(local_308._20_4_,local_308._16_4_))
              {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_308,
                           (iterator)local_308._8_8_,(float *)&local_298);
              }
              else {
                *(float *)local_308._8_8_ = fVar55;
                local_308._8_8_ = local_308._8_8_ + 4;
              }
              lVar47 = lVar47 + 1;
              p_Var54 = (_func_int *)
                        ((long)&this->_vptr_ConvolutionDepthWise_x86 +
                        (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
            } while (lVar47 < *(int *)(&this->field_0x108 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_d8,(vector<float,_std::allocator<float>_> *)local_308);
          convdw3x3s2_int8_dequant_sse
                    (&local_238,dst,(Mat *)(p_Var54 + 0x168),(Mat *)(p_Var54 + 0x1b0),&local_d8,
                     opt_00);
        }
        else {
          local_308._0_8_ = (pointer)0x0;
          local_308._8_8_ = (Allocator *)0x0;
          local_308._16_4_ = 0;
          local_308._20_4_ = 0;
          p_Var54 = (_func_int *)
                    ((long)&this->_vptr_ConvolutionDepthWise_x86 +
                    (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
          if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])) {
            lVar47 = 0;
            local_308._8_8_ = (float *)0x0;
            do {
              fVar55 = *(float *)(*(long *)(p_Var54 + 0x1f8) + lVar47 * 4);
              fVar81 = 0.0;
              if (fVar55 != 0.0) {
                fVar81 = 1.0 / (fVar55 * *(float *)(*(long *)(p_Var54 + 0x240) + lVar47 * 4));
              }
              local_298.data = (void *)CONCAT44(local_298.data._4_4_,fVar81);
              local_1e8 = (void *)CONCAT44(local_1e8._4_4_,
                                           *(undefined4 *)(*(long *)(p_Var54 + 0x288) + lVar47 * 4))
              ;
              if ((float *)local_308._8_8_ == (float *)CONCAT44(local_308._20_4_,local_308._16_4_))
              {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_308,
                           (iterator)local_308._8_8_,(float *)&local_298);
              }
              else {
                *(float *)local_308._8_8_ = fVar81;
                local_308._8_8_ = local_308._8_8_ + 4;
              }
              if ((float *)local_308._8_8_ == (float *)CONCAT44(local_308._20_4_,local_308._16_4_))
              {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_308,
                           (iterator)local_308._8_8_,(float *)&local_1e8);
              }
              else {
                *(float *)local_308._8_8_ = local_1e8._0_4_;
                local_308._8_8_ = local_308._8_8_ + 4;
              }
              lVar47 = lVar47 + 1;
              p_Var54 = (_func_int *)
                        ((long)&this->_vptr_ConvolutionDepthWise_x86 +
                        (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
            } while (lVar47 < *(int *)(&this->field_0x108 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_c0,(vector<float,_std::allocator<float>_> *)local_308);
          convdw3x3s2_int8_requant_sse
                    (&local_238,dst,(Mat *)(p_Var54 + 0x168),(Mat *)(p_Var54 + 0x1b0),&local_c0,
                     opt_00);
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
        if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_308._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_308._0_8_,
                          CONCAT44(local_308._20_4_,local_308._16_4_) - local_308._0_8_);
        }
        pLVar13 = this->activation;
      }
      if (pLVar13 != (Layer *)0x0) {
        (*pLVar13->_vptr_Layer[9])(pLVar13,dst,opt);
        iVar58 = 0;
        goto LAB_00291aa2;
      }
    }
    else {
LAB_002914e4:
      __n = (long)*(int *)(&this->field_0xd8 + (long)p_Var54) * (long)iVar52;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_308,__n,(allocator_type *)&local_298);
      uVar42 = local_308._0_8_;
      pp_Var11 = this->_vptr_ConvolutionDepthWise_x86;
      p_Var54 = pp_Var11[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var54)) {
        iVar52 = *(int *)(&this->field_0xe0 + (long)p_Var54);
        iVar59 = *(int *)(&this->field_0xdc + (long)p_Var54);
        iVar56 = *(int *)(&this->field_0xd4 + (long)p_Var54);
        iVar58 = 0;
        fVar55 = 0.0;
        iVar72 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var11[-3])) {
            lVar47 = 0;
            do {
              *(float *)(local_308._0_8_ + (iVar72 + lVar47) * 4) = fVar55;
              fVar55 = (float)((int)fVar55 + *(int *)(&this->field_0xdc + (long)pp_Var11[-3]));
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 < *(int *)(&this->field_0xd4 + (long)pp_Var11[-3]));
            iVar72 = iVar72 + (int)lVar47;
          }
          fVar55 = (float)((int)fVar55 + (iVar53 * iVar52 - iVar59 * iVar56));
          iVar58 = iVar58 + 1;
        } while (iVar58 < *(int *)(&this->field_0xd8 + (long)pp_Var11[-3]));
      }
      if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])) {
        local_330 = (int)__n;
        local_130 = (long)local_330;
        pp_Var11 = this->_vptr_ConvolutionDepthWise_x86;
        local_2a8 = 0;
        lVar47 = 0;
        do {
          if (-1 < (int)local_248) {
            local_2a0 = (pointer)(local_238.cstep * lVar47 *
                                  CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize)
                                 + (long)local_238.data);
            local_318 = (float *)(local_2b8->cstep * lVar47 * local_2b8->elemsize +
                                 (long)local_2b8->data);
            local_240 = (pointer)((long)local_238.w *
                                 CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize));
            lVar50 = *(long *)(&this->field_0x168 + (long)pp_Var11[-3]) + local_2a8;
            local_2b0 = 0;
            local_2c0 = local_318;
            do {
              if (-1 < iVar48) {
                lVar45 = (long)(int)local_2b0;
                iVar52 = 0;
                do {
                  p_Var54 = pp_Var11[-3];
                  fVar81 = 0.0;
                  fVar55 = 0.0;
                  if (0 < local_330) {
                    uVar49 = 0;
                    iVar59 = 0;
                    do {
                      iVar59 = iVar59 + (int)*(char *)(lVar50 + uVar49) *
                                        (int)*(char *)((long)local_2a0 +
                                                      (long)(int)*(pointer)(uVar42 + uVar49 * 4) +
                                                      *(int *)(&this->field_0xe8 + (long)p_Var54) *
                                                      lVar45 * (long)local_240 +
                                                      (long)iVar52 *
                                                      (long)*(int *)(&this->field_0xe4 +
                                                                    (long)p_Var54));
                      uVar49 = uVar49 + 1;
                    } while ((__n & 0xffffffff) != uVar49);
                    fVar55 = (float)iVar59;
                  }
                  fVar82 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var54) + lVar47 * 4);
                  if (fVar82 != 0.0) {
                    fVar81 = 1.0 / (fVar82 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var54
                                                                 ) + lVar47 * 4));
                  }
                  fVar81 = fVar81 * fVar55;
                  if (*(int *)(&this->field_0x100 + (long)p_Var54) != 0) {
                    fVar81 = fVar81 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var54) +
                                                lVar47 * 4);
                  }
                  fVar55 = fVar81;
                  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var54)) {
                  case 1:
                    if (fVar81 <= 0.0) {
                      fVar55 = 0.0;
                    }
                    break;
                  case 2:
                    fVar55 = (float)(-(uint)(0.0 < fVar81) & 0x3f800000 |
                                    ~-(uint)(0.0 < fVar81) &
                                    **(uint **)(&this->field_0x118 + (long)p_Var54)) * fVar81;
                    break;
                  case 3:
                    fVar55 = **(float **)(&this->field_0x118 + (long)p_Var54);
                    if (fVar81 <= fVar55) {
                      fVar81 = fVar55;
                    }
                    fVar82 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                    fVar55 = fVar81;
                    if (fVar82 <= fVar81) {
                      fVar55 = fVar82;
                    }
                    break;
                  case 4:
                    fVar55 = expf(-fVar81);
                    fVar55 = 1.0 / (fVar55 + 1.0);
                    break;
                  case 5:
                    local_148 = ZEXT416((uint)fVar81);
                    fVar55 = expf(fVar81);
                    fVar55 = logf(fVar55 + 1.0);
                    fVar55 = tanhf(fVar55);
                    fVar55 = fVar55 * (float)local_148._0_4_;
                    break;
                  case 6:
                    fVar82 = **(float **)(&this->field_0x118 + (long)p_Var54);
                    fVar83 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                    fVar85 = -fVar83 / fVar82;
                    fVar55 = 0.0;
                    if ((fVar85 <= fVar81) && (fVar55 = fVar81, fVar81 <= fVar85 + 1.0 / fVar82)) {
                      fVar55 = (fVar82 * fVar81 + fVar83) * fVar81;
                    }
                  }
                  if (iVar8 < 0x65) {
                    *local_2c0 = fVar55;
                    local_2c0 = local_2c0 + 1;
                  }
                  else {
                    fVar55 = roundf(fVar55 * *(float *)(*(long *)(&this->field_0x288 + (long)p_Var54
                                                                 ) + lVar47 * 4));
                    iVar59 = (int)fVar55;
                    if (iVar59 < -0x7e) {
                      iVar59 = -0x7f;
                    }
                    uVar43 = (undefined1)iVar59;
                    if (0x7e < iVar59) {
                      uVar43 = 0x7f;
                    }
                    *(undefined1 *)local_318 = uVar43;
                    local_318 = (float *)((long)local_318 + 1);
                  }
                  bVar63 = iVar52 != iVar48;
                  iVar52 = iVar52 + 1;
                } while (bVar63);
              }
              iVar52 = (int)local_2b0;
              local_2b0 = (ulong)(iVar52 + 1);
            } while (iVar52 != (int)local_248);
          }
          lVar47 = lVar47 + 1;
          local_2a8 = local_2a8 + local_130;
        } while (lVar47 < *(int *)(&this->field_0x108 + (long)pp_Var11[-3]));
      }
      if ((pointer)local_308._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_308._0_8_,
                        CONCAT44(local_308._20_4_,local_308._16_4_) - local_308._0_8_);
      }
    }
    iVar58 = 0;
    goto LAB_00291aa2;
  }
  uVar49 = 1;
  if (opt->use_packing_layout == true) {
    uVar49 = (ulong)((uint)(((&this->field_0xd0)[(long)p_Var54] & 3) == 0) * 3 + 1);
  }
  uVar9 = (uint)uVar49;
  uVar62 = (ulong)(uVar9 * 4);
  if (100 < *(int *)(&this->field_0x10c + (long)p_Var54)) {
    uVar62 = uVar49;
  }
  Mat::create(local_2b8,iVar52,iVar59,*(int *)(&this->field_0xd0 + (long)p_Var54) / (int)uVar9,
              uVar62,uVar9,opt->blob_allocator);
  auVar41 = local_2d8;
  iVar58 = -100;
  local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_);
  if ((dst->data == (void *)0x0) ||
     (local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_),
     (long)dst->c * dst->cstep == 0)) goto LAB_00291aa2;
  uVar51 = (int)uVar51 /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
  uVar44 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
  local_2c0 = (float *)CONCAT44(local_2c0._4_4_,uVar44);
  local_334 = 1;
  _elempack = 1;
  if (opt->use_packing_layout == true) {
    local_334 = 1;
    if ((uVar51 & 7) == 0) {
      local_334 = 8;
    }
    _elempack = (uint)((uVar44 & 3) == 0) * 3 + 1;
  }
  piVar10 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  local_308._0_8_ = local_238.data;
  local_308._8_4_ = local_238.refcount._0_4_;
  local_308._12_4_ = local_238.refcount._4_4_;
  local_308._16_4_ = (undefined4)local_238.elemsize;
  local_308._20_4_ = local_238.elemsize._4_4_;
  local_308._24_4_ = local_238.elempack;
  local_308._32_8_ = local_238.allocator;
  local_308._44_4_ = local_238.w;
  local_308._40_4_ = local_238.dims;
  local_2d8._4_4_ = local_238.d;
  local_2d8._0_4_ = local_238.h;
  local_2d8._12_4_ = auVar41._12_4_;
  local_2d8._8_4_ = local_238.c;
  local_2c8 = local_238.cstep;
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + 1;
    UNLOCK();
  }
  if (local_334 < iVar56) {
    local_298.data = *(void **)opt;
    uVar26 = opt->openmp_blocktime;
    uVar27 = opt->use_winograd_convolution;
    uVar29 = opt->use_sgemm_convolution;
    uVar31 = opt->use_int8_inference;
    uVar33 = opt->use_vulkan_compute;
    uVar32 = CONCAT11(uVar33,uVar31);
    uVar30 = CONCAT21(uVar32,uVar29);
    uVar28 = CONCAT31(uVar30,uVar27);
    local_298.allocator = *(Allocator **)&opt->use_bf16_storage;
    local_298._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    local_298._48_8_ = *(undefined8 *)&opt->flush_denormals;
    local_298.c._0_1_ = opt->use_reserved_4;
    local_298.c._1_1_ = opt->use_reserved_5;
    local_298.c._2_1_ = opt->use_reserved_6;
    local_298.c._3_1_ = opt->use_reserved_7;
    local_298._60_1_ = opt->use_reserved_8;
    local_298._61_1_ = opt->use_reserved_9;
    local_298._62_1_ = opt->use_reserved_10;
    local_298._63_1_ = opt->use_reserved_11;
    local_298.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    local_298.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_298.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_298.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_298.elempack = uVar26;
    local_298._28_4_ = uVar28;
    convert_packing(&local_238,(Mat *)local_308,local_334,(Option *)&local_298);
    dst = local_2b8;
  }
  local_298.data = dst->data;
  piVar10 = dst->refcount;
  local_298.refcount._0_4_ = SUB84(piVar10,0);
  local_298.refcount._4_4_ = (undefined4)((ulong)piVar10 >> 0x20);
  local_298.elemsize._0_4_ = (undefined4)dst->elemsize;
  local_298.elemsize._4_4_ = (undefined4)(dst->elemsize >> 0x20);
  local_298.elempack = dst->elempack;
  local_298.allocator = dst->allocator;
  local_298.dims = dst->dims;
  local_298.w = dst->w;
  local_298.h = dst->h;
  local_298.d = dst->d;
  local_298.c = dst->c;
  local_298.cstep = dst->cstep;
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + 1;
    UNLOCK();
  }
  if (_elempack < uVar9) {
    Mat::create(&local_298,iVar52,iVar59,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) /
                (int)_elempack,(ulong)((int)(uVar62 / uVar49) * _elempack),_elempack,
                opt->workspace_allocator);
    iVar58 = -100;
    if ((local_298.data != (void *)0x0) &&
       (dst = local_2b8, (long)local_298.c * local_298.cstep != 0)) goto LAB_00290e29;
  }
  else {
LAB_00290e29:
    if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])) {
      iVar52 = (int)local_2c0 / (int)_elempack;
      iVar48 = 0;
      iVar59 = 0;
      lVar47 = 0;
      do {
        if (local_308._40_4_ == 3) {
          lVar45 = (long)(iVar48 / local_334) * local_2c8 *
                   CONCAT44(local_308._20_4_,local_308._16_4_);
          local_1c0._0_4_ = 3;
          uStack_1b8 = CONCAT44(1,local_2d8._0_4_);
          lVar50 = (long)(int)local_2d8._0_4_ * (long)(int)local_308._44_4_ *
                   CONCAT44(local_308._20_4_,local_308._16_4_);
        }
        else {
          lVar45 = (long)(iVar48 / local_334) * local_2c8 *
                   CONCAT44(local_308._20_4_,local_308._16_4_);
          local_1c0._0_4_ = 4;
          uStack_1b8 = local_2d8._0_8_;
          lVar50 = (long)(int)local_2d8._0_4_ * (long)(int)local_308._44_4_ *
                   (long)(int)local_2d8._4_4_ * CONCAT44(local_308._20_4_,local_308._16_4_);
        }
        local_1e8 = (void *)(lVar45 + local_308._0_8_);
        local_1c0 = CONCAT44(local_308._44_4_,(undefined4)local_1c0);
        local_1c8 = (Allocator *)local_308._32_8_;
        local_1d0 = local_308._24_4_;
        uStack_1d4 = local_308._20_4_;
        local_1d8 = local_308._16_4_;
        uStack_1dc = 0;
        uStack_1e0 = 0;
        local_1a8 = (lVar50 + 0xfU & 0xfffffffffffffff0) /
                    CONCAT44(local_308._20_4_,local_308._16_4_);
        lVar50 = (long)local_298.h;
        if (local_298.dims == 3) {
          lVar45 = (long)(iVar59 / (int)_elempack) * local_298.cstep *
                   CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize);
          local_170._0_4_ = 3;
          uStack_168._4_4_ = 1;
          uStack_168._0_4_ = local_298.h;
          lVar50 = lVar50 * local_298.w *
                   CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize);
        }
        else {
          lVar45 = (long)(iVar59 / (int)_elempack) * local_298.cstep *
                   CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize);
          lVar57 = (long)local_298.d;
          local_170._0_4_ = 4;
          uStack_168._0_4_ = local_298.h;
          uStack_168._4_4_ = local_298.d;
          lVar50 = lVar50 * local_298.w *
                   lVar57 * CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize);
        }
        local_198 = (void *)(lVar45 + (long)local_298.data);
        local_170 = CONCAT44(local_298.w,(undefined4)local_170);
        local_178 = local_298.allocator;
        local_180 = local_298.elempack;
        uStack_184 = local_298.elemsize._4_4_;
        local_188 = (undefined4)local_298.elemsize;
        uStack_18c = 0;
        uStack_190 = 0;
        local_158 = (lVar50 + 0xfU & 0xfffffffffffffff0) /
                    CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize);
        pLVar13 = (this->group_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar47];
        local_78._0_1_ = opt->lightmode;
        local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
        local_78._4_4_ = opt->num_threads;
        local_68 = *(undefined4 *)&opt->workspace_allocator;
        uStack_64 = *(undefined4 *)((long)&opt->workspace_allocator + 4);
        iStack_60 = opt->openmp_blocktime;
        uStack_5c._0_1_ = opt->use_winograd_convolution;
        uStack_5c._1_1_ = opt->use_sgemm_convolution;
        uStack_5c._2_1_ = opt->use_int8_inference;
        uStack_5c._3_1_ = opt->use_vulkan_compute;
        local_58._0_1_ = opt->use_bf16_storage;
        local_58._1_1_ = opt->use_fp16_packed;
        local_58._2_1_ = opt->use_fp16_storage;
        local_58._3_1_ = opt->use_fp16_arithmetic;
        uStack_54._0_1_ = opt->use_int8_packed;
        uStack_54._1_1_ = opt->use_int8_storage;
        uStack_54._2_1_ = opt->use_int8_arithmetic;
        uStack_54._3_1_ = opt->use_packing_layout;
        uStack_50._0_1_ = opt->use_shader_pack8;
        uStack_50._1_1_ = opt->use_subgroup_basic;
        uStack_50._2_1_ = opt->use_subgroup_vote;
        uStack_50._3_1_ = opt->use_subgroup_ballot;
        uStack_4c._0_1_ = opt->use_subgroup_shuffle;
        uStack_4c._1_1_ = opt->use_image_storage;
        uStack_4c._2_1_ = opt->use_tensor_storage;
        uStack_4c._3_1_ = opt->use_weight_fp16_storage;
        local_48._0_4_ = opt->flush_denormals;
        local_48._4_1_ = opt->use_local_pool_allocator;
        local_48._5_1_ = opt->use_reserved_1;
        local_48._6_1_ = opt->use_reserved_2;
        local_48._7_1_ = opt->use_reserved_3;
        uStack_40._0_1_ = opt->use_reserved_4;
        uStack_40._1_1_ = opt->use_reserved_5;
        uStack_40._2_1_ = opt->use_reserved_6;
        uStack_40._3_1_ = opt->use_reserved_7;
        uStack_40._4_1_ = opt->use_reserved_8;
        uStack_40._5_1_ = opt->use_reserved_9;
        uStack_40._6_1_ = opt->use_reserved_10;
        uStack_40._7_1_ = opt->use_reserved_11;
        pAStack_70 = dst->allocator;
        local_1b0 = (int)uVar51 / local_334;
        local_160 = iVar52;
        (*pLVar13->_vptr_Layer[7])(pLVar13,&local_1e8,&local_198,&local_78);
        piVar10 = (int *)CONCAT44(uStack_18c,uStack_190);
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            if (local_178 == (Allocator *)0x0) {
              if (local_198 != (void *)0x0) {
                free(local_198);
              }
            }
            else {
              (*local_178->_vptr_Allocator[3])();
            }
          }
        }
        local_158 = 0;
        local_198 = (void *)0x0;
        uStack_190 = 0;
        uStack_18c = 0;
        local_188 = 0;
        uStack_184 = 0;
        local_180 = 0;
        local_170 = 0;
        uStack_168 = 0;
        local_160 = 0;
        piVar10 = (int *)CONCAT44(uStack_1dc,uStack_1e0);
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            if (local_1c8 == (Allocator *)0x0) {
              if (local_1e8 != (void *)0x0) {
                free(local_1e8);
              }
            }
            else {
              (*local_1c8->_vptr_Allocator[3])();
            }
          }
        }
        local_1a8 = 0;
        local_1e8 = (void *)0x0;
        uStack_1e0 = 0;
        uStack_1dc = 0;
        local_1d8 = 0;
        uStack_1d4 = 0;
        local_1d0 = 0;
        local_1c0 = 0;
        uStack_1b8 = 0;
        local_1b0 = 0;
        lVar47 = lVar47 + 1;
        iVar59 = iVar59 + (int)local_2c0;
        iVar48 = iVar48 + uVar51;
      } while (lVar47 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]
                                ));
    }
    if (_elempack < uVar9) {
      convert_packing(&local_298,dst,uVar9,opt);
      iVar58 = 0;
    }
    else {
      iVar58 = 0;
      if (&local_298 != dst) {
        piVar10 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + 1;
          UNLOCK();
        }
        piVar10 = dst->refcount;
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            if (dst->allocator == (Allocator *)0x0) {
              if (dst->data != (void *)0x0) {
                free(dst->data);
              }
            }
            else {
              (*dst->allocator->_vptr_Allocator[3])();
            }
          }
        }
        iVar58 = 0;
        dst->cstep = 0;
        dst->data = (void *)0x0;
        dst->refcount = (int *)0x0;
        *(undefined8 *)((long)&dst->refcount + 4) = 0;
        *(undefined8 *)((long)&dst->elemsize + 4) = 0;
        dst->dims = 0;
        dst->w = 0;
        dst->h = 0;
        dst->d = 0;
        dst->c = 0;
        dst->data = local_298.data;
        dst->refcount = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
        dst->elemsize = CONCAT44(local_298.elemsize._4_4_,(undefined4)local_298.elemsize);
        dst->elempack = local_298.elempack;
        dst->allocator = local_298.allocator;
        dst->dims = local_298.dims;
        dst->w = local_298.w;
        dst->h = local_298.h;
        dst->d = local_298.d;
        dst->c = local_298.c;
        dst->cstep = local_298.cstep;
      }
    }
  }
  piVar10 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_298.allocator == (Allocator *)0x0) {
        if (local_298.data != (void *)0x0) {
          free(local_298.data);
        }
      }
      else {
        (*(local_298.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_298.cstep = 0;
  local_298.data = (void *)0x0;
  local_298.refcount._0_4_ = 0;
  local_298.refcount._4_4_ = 0;
  local_298.elemsize._0_4_ = 0;
  local_298.elemsize._4_4_ = 0;
  local_298.elempack = 0;
  local_298.dims = 0;
  local_298.w = 0;
  local_298.h = 0;
  local_298.d = 0;
  local_298._56_8_ = local_298._56_8_ & 0xffffffff00000000;
  piVar10 = (int *)CONCAT44(local_308._12_4_,local_308._8_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if ((Allocator *)local_308._32_8_ == (Allocator *)0x0) {
        if ((pointer)local_308._0_8_ != (pointer)0x0) {
          free((void *)local_308._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_308._32_8_)[3])();
      }
    }
  }
  local_2c8 = 0;
  local_308._0_8_ = (pointer)0x0;
  local_308._8_8_ = (Allocator *)0x0;
  local_308._16_4_ = 0;
  local_308._20_4_ = 0;
  local_308._24_4_ = 0;
  local_308._40_4_ = 0;
  local_308._44_4_ = 0;
  local_2d8._0_12_ = ZEXT812(0);
LAB_00291aa2:
  piVar10 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if ((pointer)local_238.data != (pointer)0x0) {
          free(local_238.data);
        }
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar10 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        if (local_128.data != (void *)0x0) {
          free(local_128.data);
        }
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar58;
}

Assistant:

int ConvolutionDepthWise_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_int8 + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}